

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O0

void __thiscall csv::CSVReader::trim_header(CSVReader *this)

{
  bool bVar1;
  pointer pTVar2;
  element_type *this_00;
  byte local_99;
  CSVRow local_90;
  CSVRow local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  int local_14;
  CSVReader *pCStack_10;
  int i;
  CSVReader *this_local;
  
  if ((this->header_trimmed & 1U) == 0) {
    local_14 = 0;
    pCStack_10 = this;
    while( true ) {
      local_99 = 0;
      if (local_14 <= (this->_format).header) {
        pTVar2 = std::
                 unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
                 ::operator->(&this->records);
        bVar1 = internals::ThreadSafeDeque<csv::CSVRow>::empty(pTVar2);
        local_99 = bVar1 ^ 0xff;
      }
      if ((local_99 & 1) == 0) break;
      if (local_14 == (this->_format).header) {
        this_00 = std::
                  __shared_ptr_access<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->col_names);
        bVar1 = internals::ColNames::empty(this_00);
        if (!bVar1) goto LAB_0010e131;
        pTVar2 = std::
                 unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
                 ::operator->(&this->records);
        internals::ThreadSafeDeque<csv::CSVRow>::pop_front(&local_58,pTVar2);
        CSVRow::operator_cast_to_vector(&local_30,&local_58);
        set_col_names(this,&local_30);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_30);
        CSVRow::~CSVRow(&local_58);
      }
      else {
LAB_0010e131:
        pTVar2 = std::
                 unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
                 ::operator->(&this->records);
        internals::ThreadSafeDeque<csv::CSVRow>::pop_front(&local_90,pTVar2);
        CSVRow::~CSVRow(&local_90);
      }
      local_14 = local_14 + 1;
    }
    this->header_trimmed = true;
  }
  return;
}

Assistant:

CSV_INLINE void CSVReader::trim_header() {
        if (!this->header_trimmed) {
            for (int i = 0; i <= this->_format.header && !this->records->empty(); i++) {
                if (i == this->_format.header && this->col_names->empty()) {
                    this->set_col_names(this->records->pop_front());
                }
                else {
                    this->records->pop_front();
                }
            }

            this->header_trimmed = true;
        }
    }